

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_bignum_expt(sexp ctx,sexp a,sexp b)

{
  sexp psVar1;
  ulong uVar2;
  ulong uVar3;
  sexp res;
  sexp local_50;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_48.var = &res;
  uVar3 = (long)b >> 1;
  uVar2 = -uVar3;
  if (0 < (long)uVar3) {
    uVar2 = uVar3;
  }
  res = (sexp)&DAT_0000043e;
  local_38.var = &local_50;
  local_50 = (sexp)0x43e;
  local_38.next = &local_48;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  res = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000003);
  local_50 = sexp_copy_bignum(ctx,(sexp)0x0,a,0);
  for (; uVar2 != 0; uVar2 = uVar2 >> 1) {
    if ((uVar2 & 1) != 0) {
      res = sexp_bignum_mul(ctx,(sexp)0x0,res,local_50);
    }
    local_50 = sexp_bignum_mul(ctx,(sexp)0x0,local_50,local_50);
  }
  if ((long)uVar3 < 0) {
    psVar1 = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000003);
    res = sexp_div(ctx,psVar1,res);
  }
  (ctx->value).context.saves = local_48.next;
  psVar1 = sexp_bignum_normalize(res);
  return psVar1;
}

Assistant:

sexp sexp_bignum_expt (sexp ctx, sexp a, sexp b) {
  sexp_sint_t e = sexp_unbox_fixnum(b);
  sexp_sint_t abs_e;
  if (e < 0)
    abs_e = -e;
  else
    abs_e = e;
  sexp_gc_var2(res, acc);
  sexp_gc_preserve2(ctx, res, acc);
  res = sexp_fixnum_to_bignum(ctx, SEXP_ONE);
  acc = sexp_copy_bignum(ctx, NULL, a, 0);
  for (; abs_e; abs_e>>=1, acc=sexp_bignum_mul(ctx, NULL, acc, acc))
    if (abs_e & 1)
      res = sexp_bignum_mul(ctx, NULL, res, acc);
  if (e < 0)
    res = sexp_div(ctx, sexp_fixnum_to_bignum(ctx, SEXP_ONE), res);
  sexp_gc_release2(ctx);
  return sexp_bignum_normalize(res);
}